

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

void __thiscall miniros::master::Master::setResolveNodeIP(Master *this,bool resolv)

{
  allocator<char> local_62;
  allocator<char> local_61;
  RpcValue local_60;
  string local_50;
  string local_30;
  
  MasterHandler::setResolveNodeIP(&this->m_handler,resolv);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"master",&local_61);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/resolve_ip",&local_62);
  local_60._type = TypeBoolean;
  local_60._value.asBool = resolv;
  ParameterStorage::setParam(&this->m_parameterStorage,&local_30,&local_50,&local_60);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Master::setResolveNodeIP(bool resolv)
{
  m_handler.setResolveNodeIP(resolv);
  m_parameterStorage.setParam("master", "/resolve_ip", resolv);
}